

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O2

void __thiscall
Minisat::Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::insert
          (Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_> *this,int k)

{
  IntMap<int,_int,_Minisat::MkIndexDefault<int>_> *this_00;
  int iVar1;
  bool bVar2;
  int *piVar3;
  int k_local;
  
  this_00 = &this->indices;
  k_local = k;
  IntMap<int,_int,_Minisat::MkIndexDefault<int>_>::reserve(this_00,k,-1);
  bVar2 = inHeap(this,k);
  if (!bVar2) {
    iVar1 = (this->heap).sz;
    piVar3 = IntMap<int,_int,_Minisat::MkIndexDefault<int>_>::operator[](this_00,k);
    *piVar3 = iVar1;
    vec<int,_int>::push(&this->heap,&k_local);
    piVar3 = IntMap<int,_int,_Minisat::MkIndexDefault<int>_>::operator[](this_00,k_local);
    percolateUp(this,*piVar3);
    return;
  }
  __assert_fail("!inHeap(k)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Heap.h"
                ,0x66,
                "void Minisat::Heap<int, Minisat::Solver::VarOrderLt>::insert(K) [K = int, Comp = Minisat::Solver::VarOrderLt, MkIndex = Minisat::MkIndexDefault<int>]"
               );
}

Assistant:

void insert(K k)
    {
        indices.reserve(k, -1);
        assert(!inHeap(k));

        indices[k] = heap.size();
        heap.push(k);
        percolateUp(indices[k]);
    }